

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O0

void __thiscall
google::protobuf::EnumValueDescriptorProto::EnumValueDescriptorProto
          (EnumValueDescriptorProto *this,EnumValueDescriptorProto *from)

{
  EnumValueDescriptorProto *from_local;
  EnumValueDescriptorProto *this_local;
  
  Message::Message(&this->super_Message);
  (this->super_Message).super_MessageLite._vptr_MessageLite =
       (_func_int **)&PTR__EnumValueDescriptorProto_00410e70;
  UnknownFieldSet::UnknownFieldSet(&this->_unknown_fields_);
  SharedCtor(this);
  MergeFrom(this,from);
  return;
}

Assistant:

EnumValueDescriptorProto::EnumValueDescriptorProto(const EnumValueDescriptorProto& from)
  : ::google::protobuf::Message() {
  SharedCtor();
  MergeFrom(from);
}